

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyStamp.hpp
# Opt level: O2

void __thiscall OpenMD::RigidBodyStamp::~RigidBodyStamp(RigidBodyStamp *this)

{
  ~RigidBodyStamp(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

int getIndex() { return index_; }